

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O3

void __thiscall Function_Pool::FunctionPoolTask::_processTask(FunctionPoolTask *this)

{
  InputImageInfo *pIVar1;
  __pid_t _Var2;
  imageException *this_00;
  void *__stat_loc;
  
  pIVar1 = (this->_infoIn1)._M_t.
           super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
           .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
  __stat_loc = (void *)((long)*(pointer *)((long)&(pIVar1->super_AreaInfo).startX + 8) -
                        *(long *)&(pIVar1->super_AreaInfo).startX >> 2);
  TaskProviderSingleton::_run(&this->super_TaskProviderSingleton,(size_t)__stat_loc);
  _Var2 = AbstractTaskProvider::_wait((AbstractTaskProvider *)this,__stat_loc);
  if ((char)_Var2 != '\0') {
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this_00,"An exception raised during task execution in function pool");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FunctionPoolTask::_processTask()
    {
        _run( _infoIn1->_size() );

        if( !_wait() ) {
            throw imageException( "An exception raised during task execution in function pool" );
        }
    }